

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O3

string * just::environment::impl::append_to_path
                   (string *__return_storage_ptr__,string *item_,string *path_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long *plVar4;
  char *pcVar5;
  size_type *psVar6;
  string *__rhs;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  paVar1 = &local_58.field_2;
  local_58.field_2._M_local_buf[0] = ':';
  local_58.field_2._M_local_buf[1] = '\0';
  local_58._M_string_length = 1;
  sVar2 = path_->_M_string_length;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (sVar2 == 0) {
LAB_001083e1:
    std::operator+(__return_storage_ptr__,item_,path_);
  }
  else {
    if (sVar2 == 1) {
      pcVar5 = (path_->_M_dataplus)._M_p;
      if (*pcVar5 == ':') goto LAB_001083e1;
    }
    else {
      pcVar5 = (path_->_M_dataplus)._M_p;
    }
    __rhs = item_;
    __lhs = &local_58;
    if (pcVar5[sVar2 - 1] == ':') {
      __rhs = &local_58;
      __lhs = item_;
    }
    std::operator+(&local_38,__lhs,__rhs);
    plVar4 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_38,0,(char *)0x0,(ulong)(path_->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT62(local_58.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_58.field_2._M_local_buf[1],
                                      local_58.field_2._M_local_buf[0])) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string append_to_path(
        const std::string& item_,
        const std::string& path_
      )
      {
        const std::string sep = path_separator();

        if (path_.empty() || path_ == sep)
        {
          return item_ + path_;
        }
        else
        {
          return path_ + (ends_with(path_, sep) ? item_ + sep : sep + item_);
        }
      }